

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<int,_4> __thiscall tcu::chopToInt<4>(tcu *this,Vector<float,_4> *v)

{
  int i;
  long lVar1;
  undefined8 extraout_RDX;
  Vector<int,_4> VVar2;
  
  Vector<int,_4>::Vector((Vector<int,_4> *)this);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(int *)(this + lVar1 * 4) = (int)v->m_data[lVar1];
  }
  VVar2.m_data[2] = (int)extraout_RDX;
  VVar2.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  VVar2.m_data._0_8_ = this;
  return (Vector<int,_4>)VVar2.m_data;
}

Assistant:

Vector<int, Size> chopToInt (const Vector<float, Size>& v)
{
	Vector<int, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = chopToInt(v.m_data[i]);
	return res;
}